

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall adios2::Engine::Close(Engine *this,int transportIndex)

{
  Engine *pointer;
  string *psVar1;
  string name;
  allocator local_60 [32];
  string local_40;
  
  pointer = this->m_Engine;
  std::__cxx11::string::string((string *)&local_40,"in call to Engine::Close",local_60);
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  adios2::core::Engine::Close((int)this->m_Engine);
  psVar1 = (string *)adios2::core::Engine::GetIO();
  std::__cxx11::string::string((string *)local_60,(string *)(this->m_Engine + 0x30));
  adios2::core::IO::RemoveEngine(psVar1);
  this->m_Engine = (Engine *)0x0;
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void Engine::Close(const int transportIndex)
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::Close");
    m_Engine->Close(transportIndex);

    // erase Engine object from IO
    core::IO &io = m_Engine->GetIO();
    const std::string name = m_Engine->m_Name;
    io.RemoveEngine(name);
    m_Engine = nullptr;
}